

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O0

_Bool find_device_by_id_callback(LIST_ITEM_HANDLE list_item,void *match_context)

{
  long *plVar1;
  char *pcVar2;
  AMQP_TRANSPORT_DEVICE_INSTANCE *device_instance;
  _Bool result;
  void *match_context_local;
  LIST_ITEM_HANDLE list_item_local;
  
  if (match_context == (void *)0x0) {
    device_instance._7_1_ = false;
  }
  else {
    plVar1 = (long *)singlylinkedlist_item_get_value(list_item);
    if (((plVar1 == (long *)0x0) || (*plVar1 == 0)) ||
       (pcVar2 = STRING_c_str((STRING_HANDLE)*plVar1), pcVar2 != (char *)match_context)) {
      device_instance._7_1_ = false;
    }
    else {
      device_instance._7_1_ = true;
    }
  }
  return device_instance._7_1_;
}

Assistant:

static bool find_device_by_id_callback(LIST_ITEM_HANDLE list_item, const void* match_context)
{
    bool result;

    if (match_context == NULL)
    {
        result = false;
    }
    else
    {
        AMQP_TRANSPORT_DEVICE_INSTANCE* device_instance = (AMQP_TRANSPORT_DEVICE_INSTANCE*)singlylinkedlist_item_get_value(list_item);

        if (device_instance == NULL ||
            device_instance->device_id == NULL ||
            STRING_c_str(device_instance->device_id) != match_context)
        {
            result = false;
        }
        else
        {
            result = true;
        }
    }

    return result;
}